

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_brcondi_i32_sparc
               (TCGContext_conflict7 *tcg_ctx,TCGCond cond,TCGv_i32 arg1,int32_t arg2,TCGLabel *l)

{
  TCGOp *pTVar1;
  TCGv_i32 arg2_00;
  uintptr_t o;
  
  if (cond != TCG_COND_NEVER) {
    if (cond != TCG_COND_ALWAYS) {
      arg2_00 = tcg_const_i32_sparc(tcg_ctx,arg2);
      tcg_gen_brcond_i32_sparc(tcg_ctx,cond,arg1,arg2_00,l);
      tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
      return;
    }
    *(short *)&l->field_0x2 = (short)((uint)*(ushort *)&l->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    pTVar1 = tcg_emit_op_sparc(tcg_ctx,INDEX_op_br);
    pTVar1->args[0] = (TCGArg)l;
  }
  return;
}

Assistant:

void tcg_gen_brcondi_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 arg1, int32_t arg2, TCGLabel *l)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_br(tcg_ctx, l);
    } else if (cond != TCG_COND_NEVER) {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_brcond_i32(tcg_ctx, cond, arg1, t0, l);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}